

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qo_manager.cc
# Opt level: O3

RC __thiscall
QO_Manager::ConvertBitmapToVec
          (QO_Manager *this,int bitmap,vector<int,_std::allocator<int>_> *relsInJoin)

{
  iterator __position;
  uint local_1c;
  
  local_1c = 0;
  do {
    if (((uint)bitmap >> (local_1c & 0x1f) & 1) != 0) {
      __position._M_current =
           (relsInJoin->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (relsInJoin->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)relsInJoin,__position,(int *)&local_1c);
      }
      else {
        *__position._M_current = local_1c;
        (relsInJoin->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_finish = __position._M_current + 1;
      }
    }
    local_1c = local_1c + 1;
  } while (local_1c < 0x20);
  return 0;
}

Assistant:

RC QO_Manager::ConvertBitmapToVec(int bitmap, vector<int> &relsInJoin){
  for(int i = 0; i < 8*sizeof(int); i++){
    if((bitmap &(1 << i)))
      relsInJoin.push_back(i);
  }
  return (0);
}